

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tls_cbc.cc
# Opt level: O0

void EVP_tls_cbc_copy_mac(uint8_t *out,size_t md_size,uint8_t *in,size_t in_len,size_t orig_len)

{
  uint8_t *puVar1;
  byte bVar2;
  uint8_t uVar3;
  int iVar4;
  crypto_word_t cVar5;
  uint8_t *tmp;
  size_t j_1;
  size_t i_1;
  uint8_t *puStack_118;
  uint8_t skip_rotate;
  size_t offset;
  uint8_t mac_ended;
  crypto_word_t is_mac_start;
  size_t j;
  size_t i;
  ulong uStack_e8;
  uint8_t mac_started;
  size_t rotate_offset;
  size_t scan_start;
  size_t mac_start;
  size_t mac_end;
  uint8_t *rotated_mac_tmp;
  uint8_t *rotated_mac;
  uint8_t rotated_mac2 [64];
  uint8_t rotated_mac1 [64];
  size_t orig_len_local;
  size_t in_len_local;
  uint8_t *in_local;
  size_t md_size_local;
  uint8_t *out_local;
  
  rotated_mac_tmp = rotated_mac2 + 0x38;
  mac_end = (size_t)&rotated_mac;
  iVar4 = constant_time_declassify_int((uint)(in_len <= orig_len));
  if (iVar4 == 0) {
    __assert_fail("constant_time_declassify_int(orig_len >= in_len)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/tls_cbc.cc"
                  ,0x56,
                  "void EVP_tls_cbc_copy_mac(uint8_t *, size_t, const uint8_t *, size_t, size_t)");
  }
  iVar4 = constant_time_declassify_int((uint)(md_size <= in_len));
  if (iVar4 == 0) {
    __assert_fail("constant_time_declassify_int(in_len >= md_size)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/tls_cbc.cc"
                  ,0x57,
                  "void EVP_tls_cbc_copy_mac(uint8_t *, size_t, const uint8_t *, size_t, size_t)");
  }
  if (0x40 < md_size) {
    __assert_fail("md_size <= EVP_MAX_MD_SIZE",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/tls_cbc.cc"
                  ,0x58,
                  "void EVP_tls_cbc_copy_mac(uint8_t *, size_t, const uint8_t *, size_t, size_t)");
  }
  if (md_size != 0) {
    rotate_offset = 0;
    if (md_size + 0x100 < orig_len) {
      rotate_offset = orig_len - (md_size + 0x100);
    }
    uStack_e8 = 0;
    i._7_1_ = 0;
    OPENSSL_memset(rotated_mac_tmp,0,md_size);
    is_mac_start = 0;
    for (j = rotate_offset; j < orig_len; j = j + 1) {
      if (md_size <= is_mac_start) {
        is_mac_start = is_mac_start - md_size;
      }
      cVar5 = constant_time_eq_w(j,in_len - md_size);
      i._7_1_ = i._7_1_ | (byte)cVar5;
      bVar2 = constant_time_ge_8(j,in_len);
      rotated_mac_tmp[is_mac_start] =
           rotated_mac_tmp[is_mac_start] | in[j] & i._7_1_ & (bVar2 ^ 0xff);
      uStack_e8 = is_mac_start & cVar5 | uStack_e8;
      is_mac_start = is_mac_start + 1;
    }
    for (puStack_118 = (uint8_t *)0x1; puStack_118 < md_size;
        puStack_118 = (uint8_t *)((long)puStack_118 << 1)) {
      tmp = puStack_118;
      for (j_1 = 0; j_1 < md_size; j_1 = j_1 + 1) {
        if (md_size <= tmp) {
          tmp = tmp + -md_size;
        }
        uVar3 = constant_time_select_8
                          ((ulong)(byte)(((byte)uStack_e8 & 1) - 1),rotated_mac_tmp[j_1],
                           rotated_mac_tmp[(long)tmp]);
        *(uint8_t *)(mac_end + j_1) = uVar3;
        tmp = tmp + 1;
      }
      puVar1 = (uint8_t *)mac_end;
      mac_end = (size_t)rotated_mac_tmp;
      uStack_e8 = uStack_e8 >> 1;
      rotated_mac_tmp = puVar1;
    }
    OPENSSL_memcpy(out,rotated_mac_tmp,md_size);
    return;
  }
  __assert_fail("md_size > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/tls_cbc.cc"
                ,0x59,
                "void EVP_tls_cbc_copy_mac(uint8_t *, size_t, const uint8_t *, size_t, size_t)");
}

Assistant:

void EVP_tls_cbc_copy_mac(uint8_t *out, size_t md_size, const uint8_t *in,
                          size_t in_len, size_t orig_len) {
  uint8_t rotated_mac1[EVP_MAX_MD_SIZE], rotated_mac2[EVP_MAX_MD_SIZE];
  uint8_t *rotated_mac = rotated_mac1;
  uint8_t *rotated_mac_tmp = rotated_mac2;

  // mac_end is the index of |in| just after the end of the MAC.
  size_t mac_end = in_len;
  size_t mac_start = mac_end - md_size;

  declassify_assert(orig_len >= in_len);
  declassify_assert(in_len >= md_size);
  assert(md_size <= EVP_MAX_MD_SIZE);
  assert(md_size > 0);

  // scan_start contains the number of bytes that we can ignore because
  // the MAC's position can only vary by 255 bytes.
  size_t scan_start = 0;
  // This information is public so it's safe to branch based on it.
  if (orig_len > md_size + 255 + 1) {
    scan_start = orig_len - (md_size + 255 + 1);
  }

  size_t rotate_offset = 0;
  uint8_t mac_started = 0;
  OPENSSL_memset(rotated_mac, 0, md_size);
  for (size_t i = scan_start, j = 0; i < orig_len; i++, j++) {
    if (j >= md_size) {
      j -= md_size;
    }
    crypto_word_t is_mac_start = constant_time_eq_w(i, mac_start);
    mac_started |= is_mac_start;
    uint8_t mac_ended = constant_time_ge_8(i, mac_end);
    rotated_mac[j] |= in[i] & mac_started & ~mac_ended;
    // Save the offset that |mac_start| is mapped to.
    rotate_offset |= j & is_mac_start;
  }

  // Now rotate the MAC. We rotate in log(md_size) steps, one for each bit
  // position.
  for (size_t offset = 1; offset < md_size; offset <<= 1, rotate_offset >>= 1) {
    // Rotate by |offset| iff the corresponding bit is set in
    // |rotate_offset|, placing the result in |rotated_mac_tmp|.
    const uint8_t skip_rotate = (rotate_offset & 1) - 1;
    for (size_t i = 0, j = offset; i < md_size; i++, j++) {
      if (j >= md_size) {
        j -= md_size;
      }
      rotated_mac_tmp[i] =
          constant_time_select_8(skip_rotate, rotated_mac[i], rotated_mac[j]);
    }

    // Swap pointers so |rotated_mac| contains the (possibly) rotated value.
    // Note the number of iterations and thus the identity of these pointers is
    // public information.
    uint8_t *tmp = rotated_mac;
    rotated_mac = rotated_mac_tmp;
    rotated_mac_tmp = tmp;
  }

  OPENSSL_memcpy(out, rotated_mac, md_size);
}